

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

void Gia_RsbAddSideInputs(Gia_Man_t *p,Vec_Wec_t *vLevels,Vec_Int_t *vWin)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  ulong uVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  Gia_Obj_t *pGVar18;
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  
  uVar9 = (ulong)vLevels->nSize;
  if (0 < (long)uVar9) {
    lVar14 = 0;
    iVar16 = 0;
    do {
      iVar16 = iVar16 + *(int *)((long)&vLevels->pArray->nSize + lVar14);
      lVar14 = lVar14 + 0x10;
    } while (uVar9 << 4 != lVar14);
    if (iVar16 != 0) {
      __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0x368,"void Gia_RsbAddSideInputs(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
    }
  }
  if (0 < vWin->nSize) {
    lVar14 = 0;
    do {
      iVar16 = vWin->pArray[lVar14];
      if (p->nTravIdsAlloc <= iVar16) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (p->pTravIds[iVar16] != p->nTravIds) {
        __assert_fail("Gia_ObjIsTravIdCurrentId(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                      ,0x36c,"void Gia_RsbAddSideInputs(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
      }
      uVar8 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iVar16);
      iVar20 = vLevels->nSize;
      if (iVar20 <= (int)uVar8) {
        iVar24 = uVar8 + 1;
        iVar5 = iVar20 * 2;
        if (iVar20 * 2 <= iVar24) {
          iVar5 = iVar24;
        }
        iVar20 = vLevels->nCap;
        if (iVar20 < iVar5) {
          if (vLevels->pArray == (Vec_Int_t *)0x0) {
            pVVar10 = (Vec_Int_t *)malloc((long)iVar5 << 4);
          }
          else {
            pVVar10 = (Vec_Int_t *)realloc(vLevels->pArray,(long)iVar5 << 4);
            iVar20 = vLevels->nCap;
          }
          vLevels->pArray = pVVar10;
          memset(pVVar10 + iVar20,0,(long)(iVar5 - iVar20) << 4);
          vLevels->nCap = iVar5;
        }
        vLevels->nSize = iVar24;
        iVar20 = iVar24;
      }
      if (((int)uVar8 < 0) || (iVar20 <= (int)uVar8)) {
LAB_007b05b6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(vLevels->pArray + uVar8,iVar16);
      lVar14 = lVar14 + 1;
    } while (lVar14 < vWin->nSize);
    uVar9 = (ulong)(uint)vLevels->nSize;
  }
  if ((int)uVar9 < 1) {
    return;
  }
  lVar14 = 0;
LAB_007b009e:
  pVVar10 = vLevels->pArray;
  if (0 < pVVar10[lVar14].nSize) {
    lVar13 = 0;
LAB_007b00c1:
    iVar16 = pVVar10[lVar14].pArray[lVar13];
    if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) {
LAB_007b0578:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar12 = p->pObjs;
    if (pGVar12 != (Gia_Obj_t *)0x0) {
      pGVar1 = pGVar12 + iVar16;
      iVar16 = 0;
      do {
        pGVar2 = pGVar12 + p->nObjs;
        if (pGVar2 <= pGVar1) goto LAB_007b0559;
        uVar8 = (int)((long)pGVar1 - (long)pGVar12 >> 2) * -0x55555555;
        if (((int)uVar8 < 0) || (p->vFanoutNums->nSize <= (int)uVar8)) {
LAB_007b053a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p->vFanoutNums->pArray[uVar8 & 0x7fffffff] <= iVar16) goto LAB_007b03e9;
        uVar4 = p->vFanout->nSize;
        if ((int)uVar4 <= (int)uVar8) goto LAB_007b053a;
        piVar6 = p->vFanout->pArray;
        uVar8 = piVar6[uVar8 & 0x7fffffff] + iVar16;
        if (((int)uVar8 < 0) || (uVar4 <= uVar8)) goto LAB_007b053a;
        iVar20 = piVar6[uVar8];
        lVar15 = (long)iVar20;
        if ((lVar15 < 0) || (p->nObjs <= iVar20)) goto LAB_007b0578;
        iVar16 = iVar16 + 1;
        if (iVar16 == 6) goto LAB_007b03e9;
        pGVar3 = pGVar12 + lVar15;
        uVar9 = *(ulong *)pGVar3;
        if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
          iVar24 = p->nTravIdsAlloc;
          if (iVar24 <= iVar20) {
LAB_007b0597:
            __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
          }
          piVar6 = p->pTravIds;
          iVar5 = p->nTravIds;
          if (piVar6[lVar15] != iVar5) {
            pGVar18 = pGVar3 + -(uVar9 & 0x1fffffff);
            if ((pGVar18 < pGVar12) || (pGVar2 <= pGVar18)) goto LAB_007b0559;
            iVar17 = (int)((long)pGVar18 - (long)pGVar12 >> 2) * -0x55555555;
            if (iVar24 <= iVar17) goto LAB_007b0597;
            if (piVar6[iVar17] == iVar5) {
              pGVar18 = pGVar3 + -(ulong)((uint)(uVar9 >> 0x20) & 0x1fffffff);
              if ((pGVar18 < pGVar12) || (pGVar2 <= pGVar18)) goto LAB_007b0559;
              iVar17 = (int)((long)pGVar18 - (long)pGVar12 >> 2) * -0x55555555;
              if (iVar24 <= iVar17) goto LAB_007b0597;
              if (piVar6[iVar17] == iVar5) {
                piVar6[lVar15] = iVar5;
                if (p->nObjs <= iVar20) goto LAB_007b0559;
                uVar8 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iVar20);
                pGVar12 = p->pObjs;
                if ((pGVar3 < pGVar12) || (pGVar12 + p->nObjs <= pGVar3)) goto LAB_007b0559;
                iVar20 = vLevels->nSize;
                if (iVar20 <= (int)uVar8) {
                  iVar24 = uVar8 + 1;
                  iVar5 = iVar20 * 2;
                  if (iVar20 * 2 <= iVar24) {
                    iVar5 = iVar24;
                  }
                  iVar20 = vLevels->nCap;
                  if (iVar20 < iVar5) {
                    if (vLevels->pArray == (Vec_Int_t *)0x0) {
                      pVVar11 = (Vec_Int_t *)malloc((long)iVar5 << 4);
                    }
                    else {
                      pVVar11 = (Vec_Int_t *)realloc(vLevels->pArray,(long)iVar5 << 4);
                      iVar20 = vLevels->nCap;
                    }
                    vLevels->pArray = pVVar11;
                    memset(pVVar11 + iVar20,0,(long)(iVar5 - iVar20) << 4);
                    vLevels->nCap = iVar5;
                  }
                  vLevels->nSize = iVar24;
                  iVar20 = iVar24;
                }
                if (((int)uVar8 < 0) || (iVar20 <= (int)uVar8)) goto LAB_007b05b6;
                Vec_IntPush(vLevels->pArray + uVar8,
                            (int)((ulong)((long)pGVar3 - (long)pGVar12) >> 2) * -0x55555555);
                pGVar12 = p->pObjs;
                if ((pGVar3 < pGVar12) || (pGVar12 + p->nObjs <= pGVar3)) goto LAB_007b0559;
                Vec_IntPush(vWin,(int)((ulong)((long)pGVar3 - (long)pGVar12) >> 2) * -0x55555555);
                pGVar12 = p->pObjs;
              }
            }
          }
        }
        if (pGVar1 < pGVar12) {
LAB_007b0559:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
      } while( true );
    }
    goto LAB_007b03fe;
  }
  goto LAB_007b0405;
LAB_007b03e9:
  lVar13 = lVar13 + 1;
  if (pVVar10[lVar14].nSize <= lVar13) goto LAB_007b03fe;
  goto LAB_007b00c1;
LAB_007b03fe:
  uVar9 = (ulong)(uint)vLevels->nSize;
LAB_007b0405:
  auVar7 = _DAT_0094e250;
  lVar14 = lVar14 + 1;
  iVar16 = (int)uVar9;
  if (iVar16 <= lVar14) {
    if (iVar16 < 1) {
      return;
    }
    pVVar10 = vLevels->pArray;
    lVar14 = (uVar9 & 0xffffffff) - 1;
    auVar19._8_4_ = (int)lVar14;
    auVar19._0_8_ = lVar14;
    auVar19._12_4_ = (int)((ulong)lVar14 >> 0x20);
    lVar14 = 0;
    auVar19 = auVar19 ^ _DAT_0094e250;
    auVar21 = _DAT_0094f530;
    auVar22 = _DAT_0094e240;
    do {
      auVar23 = auVar22 ^ auVar7;
      iVar20 = auVar19._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar20 && auVar19._0_4_ < auVar23._0_4_ ||
                  iVar20 < auVar23._4_4_) & 1)) {
        *(undefined4 *)((long)&pVVar10->nSize + lVar14) = 0;
      }
      if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
          auVar23._12_4_ <= auVar19._12_4_) {
        *(undefined4 *)((long)&pVVar10[1].nSize + lVar14) = 0;
      }
      auVar23 = auVar21 ^ auVar7;
      iVar24 = auVar23._4_4_;
      if (iVar24 <= iVar20 && (iVar24 != iVar20 || auVar23._0_4_ <= auVar19._0_4_)) {
        *(undefined4 *)((long)&pVVar10[2].nSize + lVar14) = 0;
        *(undefined4 *)((long)&pVVar10[3].nSize + lVar14) = 0;
      }
      lVar13 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 4;
      auVar22._8_8_ = lVar13 + 4;
      lVar13 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar13 + 4;
      lVar14 = lVar14 + 0x40;
    } while ((ulong)(iVar16 + 3U >> 2) << 6 != lVar14);
    return;
  }
  goto LAB_007b009e;
}

Assistant:

void Gia_RsbAddSideInputs( Gia_Man_t * p, Vec_Wec_t * vLevels, Vec_Int_t * vWin )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, iObj;
    // precondition: the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // precondition: window nodes are labeled with the current ID
    Vec_IntForEachEntry( vWin, iObj, i )
    {
        assert( Gia_ObjIsTravIdCurrentId(p, iObj) );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iObj), iObj );
    }
    // iterate through all objects and explore their fanouts
    Vec_WecForEachLevel( vLevels, vLevel, k )
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    Vec_IntPush( vWin, Gia_ObjId(p, pFanout) );
                }
            }
    // iterate through the nodes in the levelized structure
    Vec_WecForEachLevel( vLevels, vLevel, k )
        Vec_IntClear( vLevel );
}